

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void list_move_node_to_tail(list *list,node *node)

{
  node *pnVar1;
  list *plVar2;
  
  pnVar1 = node->next;
  if (pnVar1 != (node *)0x0) {
    plVar2 = (list *)node->previous;
    if ((list *)node->previous == (list *)0x0) {
      plVar2 = list;
    }
    plVar2->head = pnVar1;
    pnVar1->previous = node->previous;
    node->next = (node *)0x0;
    node->previous = (node *)0x0;
    list->size = list->size - 1;
    pnVar1 = list->tail;
    if (pnVar1 != (node *)0x0 && list != (list *)0x0) {
      node->previous = pnVar1;
      plVar2 = list;
      if (pnVar1->next != (node *)0x0) {
        node->next = pnVar1->next;
        plVar2 = (list *)pnVar1->next;
      }
      plVar2->tail = node;
      pnVar1->next = node;
      list->size = list->size + 1;
    }
  }
  return;
}

Assistant:

void list_move_node_to_tail(struct list *list, struct node *node)
{
        if (node->next == NULL) {
                return;
        }

        list_remove(list, node);

        list_insert_node_after(list, list->tail, node);
}